

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void threadFunc(int id,int numThreads,World *world,Tracer *tracer,Camera *camera,RGBColor *frame)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int startX_00;
  ViewPlane *pVVar5;
  int iVar6;
  undefined4 local_6c;
  undefined4 local_68;
  int tileSizeY;
  int tileSizeX;
  int startY;
  int startX;
  int row;
  int column;
  int index;
  int iteration;
  bool hasFinished;
  int numRows;
  int numColumns;
  int height;
  int width;
  RGBColor *frame_local;
  Camera *camera_local;
  Tracer *tracer_local;
  World *world_local;
  int numThreads_local;
  int id_local;
  
  pVVar5 = pm::World::viewPlane(world);
  iVar1 = pm::ViewPlane::width(pVVar5);
  pVVar5 = pm::World::viewPlane(world);
  iVar2 = pm::ViewPlane::height(pVVar5);
  iVar3 = iVar1 / 0x10 + 1;
  column = 0;
  while( true ) {
    iVar4 = column * numThreads + id;
    iVar6 = iVar4 % iVar3;
    iVar4 = iVar4 / iVar3;
    if (iVar2 / 0x10 < iVar4) break;
    startX_00 = iVar6 * 0x10;
    if (iVar1 < startX_00 + 0x10) {
      local_68 = iVar1 + iVar6 * -0x10;
    }
    else {
      local_68 = 0x10;
    }
    if (iVar2 < iVar4 * 0x10 + 0x10) {
      local_6c = iVar2 + iVar4 * -0x10;
    }
    else {
      local_6c = 0x10;
    }
    pm::Camera::renderScene(camera,world,tracer,frame,startX_00,iVar4 * 0x10,local_68,local_6c);
    column = column + 1;
  }
  return;
}

Assistant:

void threadFunc(int id, int numThreads, pm::World &world, pm::Tracer &tracer, pm::Camera &camera, pm::RGBColor *frame)
{
	const int width = world.viewPlane().width();
	const int height = world.viewPlane().height();
	const int numColumns = (width / TileSize) + 1;
	const int numRows = (height / TileSize) + 1;

	bool hasFinished = false;
	int iteration = 0;

	while (hasFinished == false)
	{
		const int index = (iteration * numThreads) + id;
		int column = index % numColumns;
		int row = index / numColumns;

		if (row > numRows - 1)
		{
			hasFinished = true;
			break;
		}

		const int startX = column * TileSize;
		const int startY = row * TileSize;
		const int tileSizeX = (startX + TileSize > width) ? width - startX : TileSize;
		const int tileSizeY = (startY + TileSize > height) ? height - startY : TileSize;

		camera.renderScene(world, tracer, frame, startX, startY, tileSizeX, tileSizeY);
		iteration++;
	}
}